

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetGXTransform(ndicapi *pol,int port,double *transform)

{
  long lVar1;
  char (*local_30) [52];
  char *dp;
  double *transform_local;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x49 < port)) {
      return 1;
    }
    local_30 = pol->GxPassiveTransforms + (port + -0x41);
  }
  else {
    local_30 = pol->GxTransforms + (port + -0x31);
  }
  if (((*local_30)[0] == 'D') || ((*local_30)[0] == '\0')) {
    pol_local._4_4_ = 1;
  }
  else if ((*local_30)[0] == 'M') {
    pol_local._4_4_ = 2;
  }
  else {
    lVar1 = ndiSignedToLong(*local_30,6);
    *transform = (double)lVar1 * 0.0001;
    lVar1 = ndiSignedToLong(*local_30 + 6,6);
    transform[1] = (double)lVar1 * 0.0001;
    lVar1 = ndiSignedToLong(*local_30 + 0xc,6);
    transform[2] = (double)lVar1 * 0.0001;
    lVar1 = ndiSignedToLong(*local_30 + 0x12,6);
    transform[3] = (double)lVar1 * 0.0001;
    lVar1 = ndiSignedToLong(*local_30 + 0x18,7);
    transform[4] = (double)lVar1 * 0.01;
    lVar1 = ndiSignedToLong(*local_30 + 0x1f,7);
    transform[5] = (double)lVar1 * 0.01;
    lVar1 = ndiSignedToLong(*local_30 + 0x26,7);
    transform[6] = (double)lVar1 * 0.01;
    lVar1 = ndiSignedToLong(*local_30 + 0x2d,6);
    transform[7] = (double)lVar1 * 0.0001;
    pol_local._4_4_ = 0;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetGXTransform(ndicapi* pol, int port, double transform[8])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxTransforms[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveTransforms[port - 'A'];
  }
  else
  {
    return NDI_DISABLED;
  }

  if (*dp == 'D' || *dp == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*dp == 'M')
  {
    return NDI_MISSING;
  }

  transform[0] = ndiSignedToLong(&dp[0],  6) * 0.0001;
  transform[1] = ndiSignedToLong(&dp[6],  6) * 0.0001;
  transform[2] = ndiSignedToLong(&dp[12], 6) * 0.0001;
  transform[3] = ndiSignedToLong(&dp[18], 6) * 0.0001;
  transform[4] = ndiSignedToLong(&dp[24], 7) * 0.01;
  transform[5] = ndiSignedToLong(&dp[31], 7) * 0.01;
  transform[6] = ndiSignedToLong(&dp[38], 7) * 0.01;
  transform[7] = ndiSignedToLong(&dp[45], 6) * 0.0001;

  return NDI_OKAY;
}